

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O2

SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *
Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::New
          (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *bucket)

{
  uint objectCount;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *pHVar4;
  size_t sVar5;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this;
  uint uVar6;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  uVar6 = (bucket->super_HeapBucket).sizeCat;
  if (0x2000 < uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0xd,"(bucket->sizeCat <= TBlockAttributes::MaxObjectSize)",
                       "bucket->sizeCat <= TBlockAttributes::MaxObjectSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    uVar6 = (bucket->super_HeapBucket).sizeCat;
  }
  objectCount = 0x8000 / (uVar6 & 0xffff);
  pHVar4 = HeapAllocator::GetNoMemProtectInstance();
  data.typeinfo =
       (type_info *)SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  local_50 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_272fe3c;
  data.filename._0_4_ = 0x14;
  pHVar4 = HeapAllocator::TrackAllocInfo(pHVar4,(TrackAllocData *)local_50);
  sVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  this = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)
         new<Memory::HeapAllocator>(0x570,pHVar4,true,0x60fb84,0,SUB81(sVar5,0));
  SmallNormalHeapBlockT
            (this,&bucket->super_HeapBucket,(ushort)uVar6,(ushort)objectCount,MediumNormalBlockType)
  ;
  return this;
}

Assistant:

SmallNormalHeapBlockT<TBlockAttributes> *
SmallNormalHeapBlockT<TBlockAttributes>::New(HeapBucketT<SmallNormalHeapBlockT<TBlockAttributes>> * bucket)
{
    CompileAssert(TBlockAttributes::MaxObjectSize <= USHRT_MAX);
    Assert(bucket->sizeCat <= TBlockAttributes::MaxObjectSize);
    Assert((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX);

    ushort objectSize = (ushort)bucket->sizeCat;
    ushort objectCount = (ushort)((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / objectSize);

    HeapBlockType blockType = (TBlockAttributes::IsSmallBlock ? HeapBlock::SmallNormalBlockType : HeapBlock::MediumNormalBlockType);
    return NoMemProtectHeapNewNoThrowPlusPrefixZ(Base::GetAllocPlusSize(objectCount), SmallNormalHeapBlockT<TBlockAttributes>, bucket, objectSize, objectCount, blockType);
}